

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CollapsingHeader(char *label,bool *p_visible,ImGuiTreeNodeFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  float fVar3;
  ImGuiWindow *pIVar4;
  byte *in_RSI;
  float _x;
  ImGuiID close_button_id;
  float button_y;
  float button_x;
  float button_size;
  ImGuiLastItemData last_item_backup;
  ImGuiContext *g;
  bool is_open;
  ImGuiID id;
  ImGuiWindow *window;
  ImVec2 *in_stack_000000b8;
  ImGuiID in_stack_000000c0;
  undefined4 in_stack_000000c4;
  ImGuiTreeNodeFlags in_stack_000000cc;
  ImGuiID in_stack_000000d0;
  ImVec2 local_8c;
  ImGuiID local_84;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  float fVar5;
  undefined4 in_stack_ffffffffffffff8c;
  ImGuiWindow *in_stack_ffffffffffffff90;
  bool local_1;
  
  pIVar4 = GetCurrentWindow();
  if ((pIVar4->SkipItems & 1U) == 0) {
    if ((in_RSI == (byte *)0x0) || ((*in_RSI & 1) != 0)) {
      ImGuiWindow::GetID(in_stack_ffffffffffffff90,
                         (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      local_1 = TreeNodeBehavior(in_stack_000000d0,in_stack_000000cc,
                                 (char *)CONCAT44(in_stack_000000c4,in_stack_000000c0),
                                 (char *)in_stack_000000b8);
      pIVar1 = GImGui;
      if (in_RSI != (byte *)0x0) {
        memcpy(&stack0xffffffffffffff8c,&GImGui->LastItemData,0x3c);
        fVar5 = pIVar1->FontSize;
        fVar3 = -(pIVar1->Style).FramePadding.x;
        _x = ImMax<float>((pIVar1->LastItemData).Rect.Min.x,
                          (fVar3 + fVar3 + (pIVar1->LastItemData).Rect.Max.x) - fVar5);
        fVar3 = (pIVar1->LastItemData).Rect.Min.y;
        local_84 = GetIDWithSeed((char *)in_stack_ffffffffffffff90,
                                 (char *)CONCAT44(in_stack_ffffffffffffff8c,fVar5),(ImGuiID)_x);
        ImVec2::ImVec2(&local_8c,_x,fVar3);
        bVar2 = CloseButton(in_stack_000000c0,in_stack_000000b8);
        if (bVar2) {
          *in_RSI = 0;
        }
        memcpy(&pIVar1->LastItemData,&stack0xffffffffffffff8c,0x3c);
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::CollapsingHeader(const char* label, bool* p_visible, ImGuiTreeNodeFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    if (p_visible && !*p_visible)
        return false;

    ImGuiID id = window->GetID(label);
    flags |= ImGuiTreeNodeFlags_CollapsingHeader;
    if (p_visible)
        flags |= ImGuiTreeNodeFlags_AllowItemOverlap | ImGuiTreeNodeFlags_ClipLabelForTrailingButton;
    bool is_open = TreeNodeBehavior(id, flags, label);
    if (p_visible != NULL)
    {
        // Create a small overlapping close button
        // FIXME: We can evolve this into user accessible helpers to add extra buttons on title bars, headers, etc.
        // FIXME: CloseButton can overlap into text, need find a way to clip the text somehow.
        ImGuiContext& g = *GImGui;
        ImGuiLastItemData last_item_backup = g.LastItemData;
        float button_size = g.FontSize;
        float button_x = ImMax(g.LastItemData.Rect.Min.x, g.LastItemData.Rect.Max.x - g.Style.FramePadding.x * 2.0f - button_size);
        float button_y = g.LastItemData.Rect.Min.y;
        ImGuiID close_button_id = GetIDWithSeed("#CLOSE", NULL, id);
        if (CloseButton(close_button_id, ImVec2(button_x, button_y)))
            *p_visible = false;
        g.LastItemData = last_item_backup;
    }

    return is_open;
}